

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void units::reduce_number_length(string *unit_string,char detect)

{
  char cVar1;
  pointer pcVar2;
  undefined4 in_EAX;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  size_t length;
  char cVar6;
  ulong uVar7;
  undefined7 in_register_00000031;
  ulong uVar8;
  char cVar9;
  string *psVar10;
  undefined4 uStack_38;
  undefined4 local_34;
  
  _uStack_38 = CONCAT44((int)CONCAT71(in_register_00000031,detect),in_EAX);
  if ((reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&reduce_number_length(std::__cxx11::string&,char)::
                                   zstring_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::string::string
              ((string *)&reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_,
               "00000",(allocator *)((long)&uStack_38 + 3));
    __cxa_atexit(std::__cxx11::string::~string,
                 &reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_);
  }
  if ((reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&reduce_number_length(std::__cxx11::string&,char)::
                                   nstring_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::string::string
              ((string *)&reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_,
               "99999",(allocator *)((long)&uStack_38 + 2));
    __cxa_atexit(std::__cxx11::string::~string,
                 &reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_);
  }
  cVar6 = (char)((ulong)_uStack_38 >> 0x20);
  psVar10 = &reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_;
  if (cVar6 == '0') {
    psVar10 = &reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_;
  }
  uVar4 = std::__cxx11::string::find((string *)unit_string,(ulong)psVar10);
  do {
    if (uVar4 == 0xffffffffffffffff) {
      return;
    }
    cVar9 = (char)unit_string;
    uVar5 = std::__cxx11::string::find_first_not_of(cVar9,(ulong)(uint)(int)cVar6);
    if (uVar5 == 0xffffffffffffffff) {
      if (((char)local_34 != '9') &&
         (uVar5 = std::__cxx11::string::rfind(cVar9,0x2e), uVar5 != 0xffffffffffffffff)) {
        uVar7 = uVar4 - 1;
        pcVar2 = (unit_string->_M_dataplus)._M_p;
        uVar8 = uVar7;
        if (uVar5 == uVar7) {
          do {
            do {
              uVar4 = uVar8;
              uVar8 = 0;
            } while (uVar4 == 0);
            cVar9 = pcVar2[uVar4 - 1];
            if (9 < (byte)(cVar9 - 0x30U)) goto LAB_0015212a;
            uVar8 = uVar4 - 1;
          } while (cVar9 == '0');
LAB_001520db:
          length = ~uVar7;
          goto LAB_00152119;
        }
        do {
          uVar5 = uVar5 + 1;
          uVar7 = uVar4;
          if (uVar4 <= uVar5) goto LAB_001520db;
        } while ((byte)(pcVar2[uVar5] - 0x30U) < 10);
      }
    }
    else {
      uVar7 = uVar5 + 1;
      pcVar2 = (unit_string->_M_dataplus)._M_p;
      cVar1 = pcVar2[uVar5];
      if (((cVar1 != '.') &&
          (((9 < (byte)(cVar1 - 0x30U) ||
            ((uVar7 < unit_string->_M_string_length &&
             (uVar5 = uVar7, 9 < (byte)(pcVar2[uVar7] - 0x30U))))) &&
           (uVar7 = std::__cxx11::string::rfind(cVar9,0x2e), uVar7 != 0xffffffffffffffff)))) &&
         (length = uVar5 - uVar7, 0xc < length)) {
        pcVar2 = (unit_string->_M_dataplus)._M_p;
        uVar8 = uVar7;
        if (uVar7 == uVar4 - 1) {
          do {
            if ((uVar8 == 0) || (cVar9 = pcVar2[uVar8 - 1], 9 < (byte)(cVar9 - 0x30U)))
            goto LAB_0015212a;
            uVar8 = uVar8 - 1;
          } while (cVar9 == '0');
LAB_00152119:
          shorten_number(unit_string,uVar7,length);
        }
        else {
          do {
            uVar7 = uVar7 + 1;
            if (uVar4 <= uVar7) {
              length = uVar5 - uVar4;
              uVar7 = uVar4;
              goto LAB_00152119;
            }
          } while ((byte)(pcVar2[uVar7] - 0x30U) < 10);
        }
      }
    }
LAB_0015212a:
    uVar4 = std::__cxx11::string::find((string *)unit_string,(ulong)psVar10);
  } while( true );
}

Assistant:

static void reduce_number_length(std::string& unit_string, char detect)
{
    static const std::string zstring("00000");
    static const std::string nstring("99999");
    const std::string& detseq(detect == '0' ? zstring : nstring);
    // search for a bunch of zeros in a row
    std::size_t indexingloc{0};

    auto zloc = unit_string.find(detseq);
    while (zloc != std::string::npos) {
        auto nloc = unit_string.find_first_not_of(detect, zloc + 5);
        indexingloc = zloc + 5;
        if (nloc != std::string::npos) {
            indexingloc = nloc + 1;
            if (unit_string[nloc] != '.') {
                if (!isDigitCharacter(unit_string[nloc]) ||
                    (unit_string.size() > nloc + 1 &&
                     !isDigitCharacter(unit_string[nloc + 1]))) {
                    if (isDigitCharacter(unit_string[nloc])) {
                        ++nloc;
                    }

                    auto dloc = unit_string.find_last_of('.', zloc);

                    if (dloc != std::string::npos && nloc - dloc > 12) {
                        bool valid = true;
                        if (dloc == zloc - 1) {
                            --zloc;
                            auto ploc = dloc;
                            valid = false;
                            while (true) {
                                if (ploc <= 0) {
                                    break;
                                }
                                --ploc;
                                if (!isDigitCharacter(unit_string[ploc])) {
                                    break;
                                }
                                if (unit_string[ploc] != '0') {
                                    valid = true;
                                    break;
                                }
                            }
                        } else {
                            auto ploc = dloc + 1;
                            while (ploc < zloc) {
                                if (!isDigitCharacter(unit_string[ploc])) {
                                    valid = false;
                                    break;
                                }
                                ++ploc;
                            }
                        }
                        if (valid) {
                            shorten_number(unit_string, zloc, nloc - zloc);
                            indexingloc = zloc + 1;
                        }
                    }
                }
            }
        } else if (detect != '9') {
            indexingloc = unit_string.size();
            auto dloc = unit_string.find_last_of('.', zloc);

            if (dloc != std::string::npos) {
                bool valid = true;
                if (dloc == zloc - 1) {
                    --zloc;
                    auto ploc = dloc;
                    valid = false;
                    while (true) {
                        if (ploc > 0) {
                            --ploc;
                            if (!isDigitCharacter(unit_string[ploc])) {
                                break;
                            }
                            if (unit_string[ploc] != '0') {
                                valid = true;
                                break;
                            }
                        }
                    }
                } else {
                    auto ploc = dloc + 1;
                    while (ploc < zloc) {
                        if (!isDigitCharacter(unit_string[ploc])) {
                            valid = false;
                            break;
                        }
                        ++ploc;
                    }
                }
                if (valid) {
                    shorten_number(unit_string, zloc, nloc - zloc);
                    indexingloc = zloc + 1;
                }
            }
        }
        zloc = unit_string.find(detseq, indexingloc);
    }
}